

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hand_rolled_sbo_cow.hpp
# Opt level: O3

void __thiscall
printable_sbo_cow::swap(printable_sbo_cow *this,handle_base **rhs_handle,buffer *rhs_buffer)

{
  buffer *pbVar1;
  uchar uVar2;
  buffer *pbVar3;
  undefined8 uVar4;
  ptrdiff_t this_offset;
  printable_sbo_cow *ppVar5;
  long lVar6;
  
  ppVar5 = (printable_sbo_cow *)this->handle_;
  pbVar1 = &this->buffer_;
  pbVar3 = (buffer *)*rhs_handle;
  if ((this + 1 <= ppVar5 || ppVar5 < pbVar1) && (rhs_buffer + 1 <= pbVar3 || pbVar3 < rhs_buffer))
  {
    this->handle_ = (handle_base *)pbVar3;
LAB_00181237:
    *rhs_handle = (handle_base *)ppVar5;
    return;
  }
  if (this + 1 <= ppVar5 || ppVar5 < pbVar1) {
    if (pbVar3 != (buffer *)0x0) {
      *rhs_handle = (handle_base *)ppVar5;
      *(undefined8 *)((this->buffer_)._M_elems + 0x10) =
           *(undefined8 *)(rhs_buffer->_M_elems + 0x10);
      uVar4 = *(undefined8 *)(rhs_buffer->_M_elems + 8);
      *(undefined8 *)pbVar1->_M_elems = *(undefined8 *)rhs_buffer->_M_elems;
      *(undefined8 *)((this->buffer_)._M_elems + 8) = uVar4;
      this->handle_ = (handle_base *)(((long)pbVar3 - (long)rhs_buffer) + (long)pbVar1);
      return;
    }
  }
  else {
    if (rhs_buffer + 1 <= pbVar3 || pbVar3 < rhs_buffer) {
      this->handle_ = (handle_base *)pbVar3;
      *(undefined8 *)(rhs_buffer->_M_elems + 0x10) =
           *(undefined8 *)((this->buffer_)._M_elems + 0x10);
      uVar4 = *(undefined8 *)((this->buffer_)._M_elems + 8);
      *(undefined8 *)rhs_buffer->_M_elems = *(undefined8 *)pbVar1->_M_elems;
      *(undefined8 *)(rhs_buffer->_M_elems + 8) = uVar4;
      ppVar5 = (printable_sbo_cow *)(((long)ppVar5 - (long)pbVar1) + (long)rhs_buffer);
      goto LAB_00181237;
    }
    if (pbVar3 != (buffer *)0x0) {
      lVar6 = 8;
      do {
        uVar2 = (this->buffer_)._M_elems[lVar6 + -8];
        (this->buffer_)._M_elems[lVar6 + -8] = rhs_buffer->_M_elems[lVar6 + -8];
        rhs_buffer->_M_elems[lVar6 + -8] = uVar2;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x20);
      this->handle_ = (handle_base *)((long)pbVar1 + ((long)pbVar3 - (long)rhs_buffer));
      *rhs_handle = (handle_base *)((long)rhs_buffer + ((long)ppVar5 - (long)pbVar1));
      return;
    }
  }
  __assert_fail("h",
                "/workspace/llm4binary/github/license_c_cmakelists/tzlaine[P]type_erasure/hand_rolled/hand_rolled_sbo_cow.hpp"
                ,0x12e,
                "static std::ptrdiff_t printable_sbo_cow::handle_offset(const handle_base *, const buffer &)"
               );
}

Assistant:

void swap (handle_base * & rhs_handle, buffer & rhs_buffer)
    {
        const bool this_heap_allocated = heap_allocated(handle_, buffer_);
        const bool rhs_heap_allocated = heap_allocated(rhs_handle, rhs_buffer);

        if (this_heap_allocated && rhs_heap_allocated) {
            std::swap(handle_, rhs_handle);
        } else if (this_heap_allocated) {
            const std::ptrdiff_t offset = handle_offset(rhs_handle, rhs_buffer);
            rhs_handle = handle_;
            buffer_ = rhs_buffer;
            handle_ = handle_ptr(char_ptr(&buffer_) + offset);
        } else if (rhs_heap_allocated) {
            const std::ptrdiff_t offset = handle_offset(handle_, buffer_);
            handle_ = rhs_handle;
            rhs_buffer = buffer_;
            rhs_handle = handle_ptr(char_ptr(&rhs_buffer) + offset);
        } else {
            const std::ptrdiff_t this_offset =
                handle_offset(handle_, buffer_);
            const std::ptrdiff_t rhs_offset =
                handle_offset(rhs_handle, rhs_buffer);
            std::swap(buffer_, rhs_buffer);
            handle_ = handle_ptr(char_ptr(&buffer_) + rhs_offset);
            rhs_handle = handle_ptr(char_ptr(&rhs_buffer) + this_offset);
        }
    }